

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::Status::ToStringSlow_abi_cxx11_
          (string *__return_storage_ptr__,Status *this,uintptr_t rep,StatusToStringMode mode)

{
  StatusCode SVar1;
  Nonnull<const_status_internal::StatusRep_*> this_00;
  StatusCode code;
  string local_98;
  AlphaNum local_78;
  size_type local_48;
  pointer local_40;
  
  if (((ulong)this & 1) == 0) {
    this_00 = RepToPointer((uintptr_t)this);
    status_internal::StatusRep::ToString_abi_cxx11_
              (__return_storage_ptr__,this_00,(StatusToStringMode)rep);
  }
  else {
    SVar1 = InlinedRepToCode((uintptr_t)this);
    StatusCodeToString_abi_cxx11_(&local_98,(lts_20250127 *)(ulong)SVar1,code);
    local_48 = local_98._M_string_length;
    local_40 = local_98._M_dataplus._M_p;
    local_78.piece_ = NullSafeStringView(": ");
    StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToStringSlow(uintptr_t rep, StatusToStringMode mode) {
  if (IsInlined(rep)) {
    return absl::StrCat(absl::StatusCodeToString(InlinedRepToCode(rep)), ": ");
  }
  return RepToPointer(rep)->ToString(mode);
}